

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyncAwait.h
# Opt level: O3

void async_simple::coro::syncAwait<async_simple::coro::Lazy<void>>(Lazy<void> *lazy)

{
  long *plVar1;
  char cVar2;
  logic_error *this;
  undefined8 extraout_RAX;
  Try<void> value;
  Condition cond;
  exception_ptr local_30;
  __semaphore_impl local_24;
  type local_20;
  
  plVar1 = *(long **)((long)(lazy->super_LazyBase<void,_false>)._coro.__handle_ + 0x18);
  if (plVar1 != (long *)0x0) {
    cVar2 = (**(code **)(*plVar1 + 0x18))();
    if (cVar2 != '\0') {
      this = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this,"do not sync await in the same executor with Lazy");
      syncAwait<async_simple::coro::Lazy<void>>((coro *)this);
      if (local_30._M_exception_object != (void *)0x0) {
        std::__exception_ptr::exception_ptr::_M_release();
      }
      _Unwind_Resume(extraout_RAX);
    }
  }
  local_20.cond = (Condition *)&local_24;
  local_24._M_counter = 0;
  local_20.value = (Try<void> *)&local_30;
  local_30._M_exception_object = (void *)0x0;
  detail::LazyBase<void,_false>::
  start<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_include_async_simple_coro_SyncAwait_h:44:16)>
            (&lazy->super_LazyBase<void,_false>,&local_20);
  std::__atomic_wait_address_bare<std::__atomic_semaphore::_M_acquire()::_lambda()_1_>
            (&local_24._M_counter,(anon_class_8_1_8991fb9c)&local_24);
  Try<void>::value((Try<void> *)&local_30);
  if (local_30._M_exception_object != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  return;
}

Assistant:

inline auto syncAwait(LazyType &&lazy) {
    auto executor = lazy.getExecutor();
    if (executor)
        logicAssert(!executor->currentThreadInExecutor(),
                    "do not sync await in the same executor with Lazy");

    util::Condition cond;
    using ValueType = typename std::decay_t<LazyType>::ValueType;

    Try<ValueType> value;
    std::move(std::forward<LazyType>(lazy))
        .start([&cond, &value](Try<ValueType> result) {
            value = std::move(result);
            cond.release();
        });
    cond.acquire();
    return std::move(value).value();
}